

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::TypeParameterSymbol::checkTypeRestriction(TypeParameterSymbol *this)

{
  string_view arg;
  bool bVar1;
  DiagCode DVar2;
  TypeParameterSymbol *this_00;
  SourceLocation noteLocation;
  Symbol *in_RDI;
  SourceRange SVar3;
  Diagnostic *diag;
  DataTypeSyntax *typeSyntax;
  Scope *scope;
  Type *type;
  Scope *in_stack_000000b8;
  undefined1 in_stack_000000c0 [16];
  DiagCode in_stack_000000d4;
  Type *in_stack_ffffffffffffff88;
  DiagCode noteCode;
  SourceLocation this_01;
  SourceLocation arg_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  DeclaredType *in_stack_fffffffffffffff0;
  
  if (*(int *)&in_RDI[2].location != 0) {
    DeclaredType::getType(in_stack_fffffffffffffff0);
    bVar1 = Type::isError((Type *)0x675fe6);
    if (!bVar1) {
      noteCode.subsystem = *(DiagSubsystem *)&in_RDI[2].location.field_0x0;
      noteCode.code = *(uint16_t *)&in_RDI[2].location.field_0x2;
      DVar2 = (DiagCode)SemanticFacts::getTypeRestriction(in_stack_ffffffffffffff88);
      if (noteCode != DVar2) {
        this_00 = (TypeParameterSymbol *)Symbol::getParentScope(in_RDI);
        DeclaredType::getTypeSyntax((DeclaredType *)&in_RDI[1].location);
        uVar4 = 0xc90006;
        SVar3 = slang::syntax::SyntaxNode::sourceRange
                          ((SyntaxNode *)CONCAT44(0xc90006,in_stack_ffffffffffffffd0));
        this_01 = SVar3.startLoc;
        arg_00 = SVar3.endLoc;
        noteLocation = (SourceLocation)
                       Scope::addDiag(in_stack_000000b8,in_stack_000000d4,
                                      (SourceRange)in_stack_000000c0);
        SemanticFacts::getTypeRestrictionText((ForwardTypeRestriction)((ulong)this_00 >> 0x20));
        arg._M_str._0_4_ = in_stack_ffffffffffffffd0;
        arg._M_len = (size_t)arg_00;
        arg._M_str._4_4_ = uVar4;
        Diagnostic::operator<<((Diagnostic *)this_01,arg);
        ast::operator<<((Diagnostic *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),(Type *)arg_00);
        bVar1 = isOverridden(this_00);
        if (bVar1) {
          Diagnostic::addNote((Diagnostic *)this_00,noteCode,noteLocation);
        }
      }
    }
  }
  return;
}

Assistant:

void TypeParameterSymbol::checkTypeRestriction() const {
    if (typeRestriction != ForwardTypeRestriction::None) {
        auto& type = targetType.getType();
        if (!type.isError() && typeRestriction != SemanticFacts::getTypeRestriction(type)) {
            auto scope = getParentScope();
            auto typeSyntax = targetType.getTypeSyntax();
            SLANG_ASSERT(scope && typeSyntax);

            auto& diag = scope->addDiag(diag::TypeRestrictionMismatch, typeSyntax->sourceRange());
            diag << SemanticFacts::getTypeRestrictionText(typeRestriction);
            diag << type;

            if (isOverridden())
                diag.addNote(diag::NoteDeclarationHere, location);
        }
    }
}